

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fout.cpp
# Opt level: O0

void write_binary<double>
               (ofstream *f,field3d<double> *data,_func_double_field3d<double>_ptr_int_int_int *get,
               int n0,int n,int ny,int nz)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  int in_ECX;
  code *in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 uVar5;
  int in_stack_00000008;
  int k_1;
  int j;
  int j_1;
  int k;
  int i;
  double *a;
  undefined4 local_44;
  undefined4 local_3c;
  undefined4 local_34;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)((in_R8D - in_ECX) * (in_R9D + in_stack_00000008));
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  for (local_34 = in_ECX; local_34 < in_R8D; local_34 = local_34 + 1) {
    iVar2 = in_stack_00000008 / 2;
    for (local_3c = 0; local_3c < in_R9D; local_3c = local_3c + 1) {
      uVar5 = (*in_RDX)(in_RSI,local_34,local_3c,iVar2);
      *(undefined8 *)
       ((long)pvVar4 + (long)((local_34 - in_ECX) * (in_R9D + in_stack_00000008) + local_3c) * 8) =
           uVar5;
    }
    for (local_44 = 0; local_44 < in_stack_00000008; local_44 = local_44 + 1) {
      uVar5 = (*in_RDX)(in_RSI,local_34,in_R9D / 2,local_44);
      *(undefined8 *)
       ((long)pvVar4 +
       (long)((local_34 - in_ECX) * (in_R9D + in_stack_00000008) + in_R9D + local_44) * 8) = uVar5;
    }
  }
  std::ostream::write(in_RDI,(long)pvVar4);
  if (pvVar4 != (void *)0x0) {
    operator_delete__(pvVar4);
  }
  return;
}

Assistant:

void write_binary(ofstream* f, field3d<T> & data, double get(field3d<T>&,
            int, int, int), int n0, int n, int ny, int nz) {
    double* a = new double[(n - n0) * (ny + nz)]; /* for values in xy and xz
                                                     planes */
    for (int i = n0; i < n; ++i) {
        int k = nz / 2;
        for (int j = 0; j < ny; ++j)
            a[(i - n0) * (ny + nz) + j] = get(data, i, j, k);
        int j = ny / 2;
        for (int k = 0; k < nz; ++k)
            a[(i - n0) * (ny + nz) + ny + k] = get(data, i, j, k);
    }
    f->write(reinterpret_cast<char*>(a), sizeof(double) * (n - n0) * (ny +
                nz));
    delete[] a;
}